

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sticky.cpp
# Opt level: O0

RealType __thiscall
OpenMD::Sticky::getSuggestedCutoffRadius
          (Sticky *this,pair<OpenMD::AtomType_*,_OpenMD::AtomType_*> atypes)

{
  int iVar1;
  int iVar2;
  reference pvVar3;
  reference this_00;
  reference pvVar4;
  AtomType *in_RDX;
  AtomType *in_RSI;
  long in_RDI;
  Sticky *unaff_retaddr;
  int stid2;
  int stid1;
  int atid2;
  int atid1;
  RealType local_8;
  
  if ((*(byte *)(in_RDI + 8) & 1) == 0) {
    initialize(unaff_retaddr);
  }
  iVar1 = AtomType::getIdent(in_RSI);
  iVar2 = AtomType::getIdent(in_RDX);
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),(long)iVar1);
  iVar1 = *pvVar3;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),(long)iVar2);
  iVar2 = *pvVar3;
  if ((iVar1 == -1) || (iVar2 == -1)) {
    local_8 = 0.0;
  }
  else {
    this_00 = std::
              vector<std::vector<OpenMD::StickyInteractionData,_std::allocator<OpenMD::StickyInteractionData>_>,_std::allocator<std::vector<OpenMD::StickyInteractionData,_std::allocator<OpenMD::StickyInteractionData>_>_>_>
              ::operator[]((vector<std::vector<OpenMD::StickyInteractionData,_std::allocator<OpenMD::StickyInteractionData>_>,_std::allocator<std::vector<OpenMD::StickyInteractionData,_std::allocator<OpenMD::StickyInteractionData>_>_>_>
                            *)(in_RDI + 0x58),(long)iVar1);
    pvVar4 = std::
             vector<OpenMD::StickyInteractionData,_std::allocator<OpenMD::StickyInteractionData>_>::
             operator[](this_00,(long)iVar2);
    local_8 = pvVar4->rbig;
  }
  return local_8;
}

Assistant:

RealType Sticky::getSuggestedCutoffRadius(pair<AtomType*, AtomType*> atypes) {
    if (!initialized_) initialize();
    int atid1 = atypes.first->getIdent();
    int atid2 = atypes.second->getIdent();
    int stid1 = Stids[atid1];
    int stid2 = Stids[atid2];

    if (stid1 == -1 || stid2 == -1)
      return 0.0;
    else { return MixingMap[stid1][stid2].rbig; }
  }